

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O2

int Nwk_ObjFindFanout(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanout)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = pObj->nFanouts;
  iVar2 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  while (((iVar1 = -1, iVar3 != iVar2 && (pObj->pFanio[pObj->nFanins + iVar2] != (Nwk_Obj_t *)0x0))
         && (iVar1 = iVar2, pObj->pFanio[pObj->nFanins + iVar2] != pFanout))) {
    iVar2 = iVar2 + 1;
  }
  return iVar1;
}

Assistant:

int Nwk_ObjFindFanout( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanout )
{  
    Nwk_Obj_t * pTemp;
    int i;
    Nwk_ObjForEachFanout( pObj, pTemp, i )
        if ( pTemp == pFanout )
            return i;
    return -1;
}